

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verStream.c
# Opt level: O3

void Ver_StreamSkipChars(Ver_Stream_t *p,char *pCharsToSkip)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  
  if (p->fStop != 0) {
    __assert_fail("!p->fStop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                  ,0x133,"void Ver_StreamSkipChars(Ver_Stream_t *, char *)");
  }
  if (pCharsToSkip == (char *)0x0) {
    __assert_fail("pCharsToSkip != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                  ,0x134,"void Ver_StreamSkipChars(Ver_Stream_t *, char *)");
  }
  pcVar2 = p->pBufferCur;
  if (p->pBufferStop < pcVar2) {
    Ver_StreamReload(p);
    pcVar2 = p->pBufferCur;
  }
  pcVar1 = p->pBufferEnd;
  if (pcVar2 < pcVar1) {
    do {
      cVar3 = *pCharsToSkip;
      if (cVar3 == '\0') {
LAB_003578bd:
        p->pBufferCur = pcVar2;
        return;
      }
      pcVar4 = pCharsToSkip + 1;
      while (*pcVar2 != cVar3) {
        cVar3 = *pcVar4;
        pcVar4 = pcVar4 + 1;
        if (cVar3 == '\0') goto LAB_003578bd;
      }
      if (*pcVar2 == '\n') {
        p->nLineCounter = p->nLineCounter + 1;
      }
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 != pcVar1);
  }
  if (p->pBufferStop == pcVar1) {
    p->fStop = 1;
    return;
  }
  printf("Ver_StreamSkipSymbol() failed to parse the file \"%s\".\n",p->pFileName);
  return;
}

Assistant:

void Ver_StreamSkipChars( Ver_Stream_t * p, char * pCharsToSkip )
{
    char * pChar, * pTemp;
    assert( !p->fStop );
    assert( pCharsToSkip != NULL );
    // check if the new data should to be loaded
    if ( p->pBufferCur > p->pBufferStop )
        Ver_StreamReload( p );
    // skip the symbols
    for ( pChar = p->pBufferCur; pChar < p->pBufferEnd; pChar++ )
    {
        // skip symbols as long as they are in the list
        for ( pTemp = pCharsToSkip; *pTemp; pTemp++ )
            if ( *pChar == *pTemp )
                break;
        if ( *pTemp == 0 ) // pChar is not found in the list
        {
            p->pBufferCur = pChar;
            return;
        }
        // count the lines
        if ( *pChar == '\n' )
            p->nLineCounter++;
    }
    // the file is finished or the last part continued 
    // through VER_OFFSET_SIZE chars till the end of the buffer
    if ( p->pBufferStop == p->pBufferEnd ) // end of file
    {
        p->fStop = 1;
        return;
    }
    printf( "Ver_StreamSkipSymbol() failed to parse the file \"%s\".\n", p->pFileName );
}